

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppc.c
# Opt level: O3

target_ulong_conflict cpu_ppc_load_hdecr_ppc64(CPUPPCState_conflict2 *env)

{
  ppc_tb_t *ppVar1;
  uint64_t uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  target_ulong_conflict tVar5;
  int iVar6;
  int64_t iVar7;
  ulong uVar8;
  ppc_tb_t *tb_env;
  
  ppVar1 = env->tb_env;
  uVar2 = ppVar1->hdecr_next;
  iVar7 = qemu_clock_get_ns(QEMU_CLOCK_VIRTUAL);
  uVar8 = uVar2 - iVar7;
  if ((long)uVar8 < 0) {
    if ((ppVar1->flags & 1) == 0) {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = -uVar8;
      auVar4 = ZEXT416(ppVar1->decr_freq) * auVar4;
      iVar6 = __udivti3(auVar4._0_8_,auVar4._8_8_,1000000000,0);
      tVar5 = -iVar6;
    }
    else {
      tVar5 = 0;
    }
  }
  else {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar8;
    auVar3 = ZEXT416(ppVar1->decr_freq) * auVar3;
    tVar5 = __udivti3(auVar3._0_8_,auVar3._8_8_,1000000000,0);
  }
  return tVar5;
}

Assistant:

target_ulong cpu_ppc_load_hdecr(CPUPPCState *env)
{
    PowerPCCPU *cpu = env_archcpu(env);
    PowerPCCPUClass *pcc = POWERPC_CPU_GET_CLASS(cpu);
    ppc_tb_t *tb_env = env->tb_env;
    uint64_t hdecr;

    hdecr =  _cpu_ppc_load_decr(env, tb_env->hdecr_next);

    /*
     * If we have a large decrementer (POWER9 or later) then hdecr is sign
     * extended to 64 bits, otherwise it is 32 bits.
     */
    if (pcc->lrg_decr_bits > 32) {
        return hdecr;
    }
    return (uint32_t) hdecr;
}